

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

int lyd_new_path_list_predicate(lyd_node *list,char *list_name,char *predicate,int *parsed)

{
  char *pcVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  ushort **ppuVar5;
  char *pcVar6;
  lyd_node *plVar7;
  LY_ERR *pLVar8;
  size_t sVar9;
  char *local_60;
  char *value;
  ulong local_50;
  int local_48;
  int local_44;
  int val_len;
  int has_predicate;
  char *name;
  int nam_len;
  
  value = (char *)list->schema;
  uVar3 = parse_schema_json_predicate
                    (predicate,(char **)&val_len,(int *)((long)&name + 4),&local_60,&local_48,
                     &local_44);
  pcVar1 = _val_len;
  if (((int)uVar3 < 1) || (iVar4 = strncmp(_val_len,".",(long)name._4_4_), iVar4 == 0)) {
    ly_vlog(LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,(ulong)(uint)(int)predicate[-(long)(int)uVar3],
            predicate + -(long)(int)uVar3);
    return -1;
  }
  ppuVar5 = __ctype_b_loc();
  if ((*(byte *)((long)*ppuVar5 + (long)*pcVar1 * 2 + 1) & 8) == 0) {
    if (value[0x1e] != '\0') {
      local_50 = 0;
      while (pcVar1 = local_60, *parsed = *parsed + uVar3, local_60 != (char *)0x0) {
        pcVar6 = (char *)**(undefined8 **)(*(long *)(value + 0x80) + local_50 * 8);
        sVar9 = (size_t)name._4_4_;
        iVar4 = strncmp(pcVar6,_val_len,sVar9);
        if ((iVar4 != 0) || (pcVar6[sVar9] != '\0')) break;
        sVar9 = (size_t)local_48;
        pcVar6 = (char *)malloc(sVar9 + 1);
        if (pcVar6 == (char *)0x0) {
          pLVar8 = ly_errno_location();
          *pLVar8 = LY_EMEM;
          ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyd_new_path_list_predicate");
          return -1;
        }
        strncpy(pcVar6,pcVar1,sVar9);
        uVar2 = local_50;
        pcVar1 = value;
        pcVar6[sVar9] = '\0';
        plVar7 = _lyd_new_leaf(list,*(lys_node **)(*(long *)(value + 0x80) + local_50 * 8),pcVar6,0)
        ;
        free(pcVar6);
        if (plVar7 == (lyd_node *)0x0) {
          return -1;
        }
        if ((ulong)(byte)pcVar1[0x1e] <= uVar2 + 1) {
          return 0;
        }
        if (local_44 == 0) {
          ly_vlog(LYE_PATH_MISSKEY,LY_VLOG_NONE,(void *)0x0,list_name);
          return -1;
        }
        predicate = predicate + uVar3;
        local_50 = uVar2 + 1;
        uVar3 = parse_schema_json_predicate
                          (predicate,(char **)&val_len,(int *)((long)&name + 4),&local_60,&local_48,
                           &local_44);
        if (((int)uVar3 < 1) || (iVar4 = strncmp(_val_len,".",(long)name._4_4_), iVar4 == 0)) {
          ly_vlog(LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,
                  (ulong)(uint)(int)predicate[-(long)(int)uVar3],predicate + -(long)(int)uVar3);
          return -1;
        }
      }
      ly_vlog(LYE_PATH_INKEY,LY_VLOG_NONE,(void *)0x0,_val_len);
      return -1;
    }
  }
  else {
    *parsed = *parsed + uVar3;
  }
  return 0;
}

Assistant:

static int
lyd_new_path_list_predicate(struct lyd_node *list, const char *list_name, const char *predicate, int *parsed)
{
    const char *name, *value;
    char *key_val;
    int r, i, nam_len, val_len, has_predicate;
    struct lys_node_list *slist;

    slist = (struct lys_node_list *)list->schema;

    /* is the predicate a number? */
    if (((r = parse_schema_json_predicate(predicate, &name, &nam_len, &value, &val_len, &has_predicate)) < 1)
            || !strncmp(name, ".", nam_len)) {
        LOGVAL(LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, predicate[-r], &predicate[-r]);
        return -1;
    }

    if (isdigit(name[0])) {
        /* position index - creating without keys */
        *parsed += r;
        return 0;
    }

    /* it's not a number, so there must be some keys */
    if (!slist->keys_size) {
        /* there are none, so pretend we did not parse anything to get invalid char error later */
        return 0;
    }

    /* go through all the keys */
    i = 0;
    goto check_parsed_values;

    for (; i < slist->keys_size; ++i) {
        if (!has_predicate) {
            LOGVAL(LYE_PATH_MISSKEY, LY_VLOG_NONE, NULL, list_name);
            return -1;
        }

        if (((r = parse_schema_json_predicate(predicate, &name, &nam_len, &value, &val_len, &has_predicate)) < 1)
                || !strncmp(name, ".", nam_len)) {
            LOGVAL(LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, predicate[-r], &predicate[-r]);
            return -1;
        }

check_parsed_values:
        *parsed += r;
        predicate += r;

        if (!value || strncmp(slist->keys[i]->name, name, nam_len) || slist->keys[i]->name[nam_len]) {
            LOGVAL(LYE_PATH_INKEY, LY_VLOG_NONE, NULL, name);
            return -1;
        }

        key_val = malloc((val_len + 1) * sizeof(char));
        if (!key_val) {
            LOGMEM;
            return -1;
        }
        strncpy(key_val, value, val_len);
        key_val[val_len] = '\0';

        if (!_lyd_new_leaf(list, (const struct lys_node *)slist->keys[i], key_val, 0)) {
            free(key_val);
            return -1;
        }
        free(key_val);
    }

    return 0;
}